

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

Fts3HashElem * fts3FindElementByHash(Fts3Hash *pH,void *pKey,int nKey,int h)

{
  int iVar1;
  _func_int_void_ptr_int_void_ptr_int *p_Var2;
  _fts3ht *pEntry;
  _func_int_void_ptr_int_void_ptr_int *xCompare;
  Fts3HashElem *pFStack_30;
  int count;
  Fts3HashElem *elem;
  int h_local;
  int nKey_local;
  void *pKey_local;
  Fts3Hash *pH_local;
  
  if (pH->ht != (_fts3ht *)0x0) {
    pFStack_30 = pH->ht[h].chain;
    xCompare._4_4_ = pH->ht[h].count;
    p_Var2 = ftsCompareFunction((int)pH->keyClass);
    for (; xCompare._4_4_ != 0 && pFStack_30 != (Fts3HashElem *)0x0; pFStack_30 = pFStack_30->next)
    {
      iVar1 = (*p_Var2)(pFStack_30->pKey,pFStack_30->nKey,pKey,nKey);
      if (iVar1 == 0) {
        return pFStack_30;
      }
      xCompare._4_4_ = xCompare._4_4_ + -1;
    }
  }
  return (Fts3HashElem *)0x0;
}

Assistant:

static Fts3HashElem *fts3FindElementByHash(
  const Fts3Hash *pH, /* The pH to be searched */
  const void *pKey,   /* The key we are searching for */
  int nKey,
  int h               /* The hash for this key. */
){
  Fts3HashElem *elem;            /* Used to loop thru the element list */
  int count;                     /* Number of elements left to test */
  int (*xCompare)(const void*,int,const void*,int);  /* comparison function */

  if( pH->ht ){
    struct _fts3ht *pEntry = &pH->ht[h];
    elem = pEntry->chain;
    count = pEntry->count;
    xCompare = ftsCompareFunction(pH->keyClass);
    while( count-- && elem ){
      if( (*xCompare)(elem->pKey,elem->nKey,pKey,nKey)==0 ){ 
        return elem;
      }
      elem = elem->next;
    }
  }
  return 0;
}